

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1309:23)>_>
::Visit<google::protobuf::EnumDescriptorProto>
          (VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1309:23)>_>
           *this,EnumDescriptor *descriptor,EnumDescriptorProto *proto)

{
  string *psVar1;
  bool bVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *pVVar3;
  undefined8 unaff_RBX;
  int index;
  undefined1 *puVar4;
  string_view file_name;
  string_view file_name_00;
  
  puVar4 = (undefined1 *)(proto->field_0)._impl_.options_;
  if ((EnumOptions *)puVar4 == (EnumOptions *)0x0) {
    puVar4 = _EnumOptions_default_instance_;
  }
  psVar1 = (*(this->visitor).super_anon_class_32_4_e643f291.file)->name_;
  file_name._M_str = &DAT_00000006;
  file_name._M_len = (size_t)(psVar1->_M_dataplus)._M_p;
  bVar2 = compiler::anon_unknown_5::ValidateTargetConstraints
                    ((anon_unknown_5 *)puVar4,
                     (Message *)
                     (((this->visitor).super_anon_class_32_4_e643f291.descriptor_pool)->_M_t).
                     super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
                     ,(DescriptorPool *)
                      &((((this->visitor).super_anon_class_32_4_e643f291.error_collector)->_M_t).
                        super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                        .
                        super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_false>
                       ._M_head_impl)->super_ErrorCollector,
                     (ErrorCollector *)psVar1->_M_string_length,file_name,
                     (OptionTargetType)unaff_RBX);
  if (!bVar2) {
    *(this->visitor).super_anon_class_32_4_e643f291.validation_error = true;
  }
  if (0 < descriptor->value_count_) {
    index = 0;
    do {
      pVVar3 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                         (&(proto->field_0)._impl_.value_.super_RepeatedPtrFieldBase,index);
      puVar4 = (undefined1 *)(pVVar3->field_0)._impl_.options_;
      if ((EnumValueOptions *)puVar4 == (EnumValueOptions *)0x0) {
        puVar4 = _EnumValueOptions_default_instance_;
      }
      psVar1 = (*(this->visitor).super_anon_class_32_4_e643f291.file)->name_;
      file_name_00._M_str = (char *)0x7;
      file_name_00._M_len = (size_t)(psVar1->_M_dataplus)._M_p;
      bVar2 = compiler::anon_unknown_5::ValidateTargetConstraints
                        ((anon_unknown_5 *)puVar4,
                         (Message *)
                         (((this->visitor).super_anon_class_32_4_e643f291.descriptor_pool)->_M_t).
                         super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
                         ,(DescriptorPool *)
                          &((((this->visitor).super_anon_class_32_4_e643f291.error_collector)->_M_t)
                            .
                            super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_false>
                           ._M_head_impl)->super_ErrorCollector,
                         (ErrorCollector *)psVar1->_M_string_length,file_name_00,
                         (OptionTargetType)unaff_RBX);
      if (!bVar2) {
        *(this->visitor).super_anon_class_32_4_e643f291.validation_error = true;
      }
      index = index + 1;
    } while (index < descriptor->value_count_);
  }
  return;
}

Assistant:

void Visit(const EnumDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.value_count(); i++) {
      Visit(*descriptor.value(i), value(proto, i)...);
    }
  }